

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

void __thiscall
QPDF::optimize(QPDF *this,
              map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              *object_stream_data,bool allow_changes,
              function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  function<int_(QPDFObjectHandle_&)> local_48;
  function<int_(QPDFObjectHandle_&)> *local_28;
  function<int_(QPDFObjectHandle_&)> *skip_stream_parameters_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmStack_18;
  bool allow_changes_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *object_stream_data_local;
  QPDF *this_local;
  
  local_28 = skip_stream_parameters;
  skip_stream_parameters_local._7_1_ = allow_changes;
  pmStack_18 = object_stream_data;
  object_stream_data_local =
       (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)this;
  std::function<int_(QPDFObjectHandle_&)>::function(&local_48,skip_stream_parameters);
  optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,object_stream_data,allow_changes,&local_48);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_48);
  return;
}

Assistant:

void
QPDF::optimize(
    std::map<int, int> const& object_stream_data,
    bool allow_changes,
    std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    optimize_internal(object_stream_data, allow_changes, skip_stream_parameters);
}